

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_itrans_recon_dc.c
# Opt level: O2

void ihevcd_itrans_recon_dc_luma
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  ulong uVar1;
  UWORD8 UVar2;
  int iVar3;
  ulong uVar4;
  undefined6 in_register_0000008a;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 1 << ((byte)log2_trans_size & 0x1f);
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  for (uVar1 = 0; uVar1 != uVar4; uVar1 = uVar1 + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = (uint)pu1_pred[uVar6] +
              (((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40 >> 1) + 0x800 >>
              0xc);
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      UVar2 = (UWORD8)iVar3;
      if (0xfe < iVar3) {
        UVar2 = 0xff;
      }
      pu1_dst[uVar6] = UVar2;
    }
    pu1_dst = pu1_dst + dst_strd;
    pu1_pred = pu1_pred + pred_strd;
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_luma(UWORD8 *pu1_pred,
                                 UWORD8 *pu1_dst,
                                 WORD32 pred_strd,
                                 WORD32 dst_strd,
                                 WORD32 log2_trans_size,
                                 WORD16 i2_coeff_value)
{
    WORD32 row, col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;

    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    for(row = 0; row < trans_size; row++)
        for(col = 0; col < trans_size; col++)
            pu1_dst[row * dst_strd + col] = CLIP_U8((pu1_pred[row * pred_strd + col] + dc_value));

}